

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_188870::testSharedAttributes(string *fn)

{
  int iVar1;
  char *pcVar2;
  reference this;
  size_type sVar3;
  MultiPartOutputFile file;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  int partCount;
  string *in_stack_000000e8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_000000f0;
  string *in_stack_000000f8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_00000100;
  string *in_stack_00000188;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_00000190;
  string *in_stack_000001c8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_000001d0;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_00000228;
  int in_stack_00000234;
  MultiPartOutputFile local_48 [32];
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_28;
  undefined4 local_c;
  
  local_c = 3;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1c4a50);
  generateRandomHeaders(in_stack_00000234,in_stack_00000228);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  this = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_28,0);
  sVar3 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_28);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile(local_48,pcVar2,this,(int)sVar3,false,iVar1);
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_48);
  testDisplayWindow(in_stack_00000100,in_stack_000000f8);
  testPixelAspectRatio(in_stack_000000f0,in_stack_000000e8);
  testTimeCode(in_stack_00000190,in_stack_00000188);
  testChromaticities(in_stack_000001d0,in_stack_000001c8);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)this);
  return;
}

Assistant:

void
testSharedAttributes (const std::string& fn)
{
    //
    // The Shared Attributes are currently:
    // Display Window
    // Pixel Aspect Ratio
    // TimeCode
    // Chromaticities
    //

    int            partCount = 3;
    vector<Header> headers;

    // This will generate headers that are valid for all parts
    generateRandomHeaders (partCount, headers);

    // expect this to be successful
    {
        remove (fn.c_str ());
        MultiPartOutputFile file (fn.c_str (), &headers[0], headers.size ());
    }

    // Adding a header a that has non-compliant standard attributes will throw
    // an exception.

    // Run the tests
    testDisplayWindow (headers, fn);
    testPixelAspectRatio (headers, fn);
    testTimeCode (headers, fn);
    testChromaticities (headers, fn);
}